

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiodevice.cpp
# Opt level: O2

void __thiscall QIODevicePrivate::setReadChannelCount(QIODevicePrivate *this,int count)

{
  QVarLengthArray<QRingBuffer,_2LL> *this_00;
  long lVar1;
  QRingBuffer *pQVar2;
  long sz;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sz = (long)count;
  this_00 = &this->readBuffers;
  if ((this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s < sz) {
    QVarLengthArray<QRingBuffer,_2LL>::reserve(this_00,sz);
    while (lVar1 = (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s, lVar1 < sz)
    {
      local_3c = this->readBufferChunkSize;
      if (local_3c == 0) {
        local_3c = 0x4000;
      }
      QVarLengthArray<QRingBuffer,_2LL>::emplace_back<int>(this_00,&local_3c);
    }
  }
  else {
    QVarLengthArray<QRingBuffer,_2LL>::resize(this_00,sz);
    lVar1 = (this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.s;
  }
  this->readChannelCount = count;
  pQVar2 = (QRingBuffer *)0x0;
  if (this->currentReadChannel < lVar1) {
    pQVar2 = (QRingBuffer *)
             ((long)this->currentReadChannel * 0x28 +
             (long)(this->readBuffers).super_QVLABase<QRingBuffer>.super_QVLABaseBase.ptr);
  }
  (this->buffer).m_buf = pQVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIODevicePrivate::setReadChannelCount(int count)
{
    if (count > readBuffers.size()) {
        readBuffers.reserve(count);

        // If readBufferChunkSize is zero, we should bypass QIODevice's
        // read buffers, even if the QIODeviceBase::Unbuffered flag is not
        // set when opened. However, if a read transaction is started or
        // ungetChar() is called, we still have to use the internal buffer.
        // To support these cases, pass a default value to the QRingBuffer
        // constructor.

        while (readBuffers.size() < count)
            readBuffers.emplace_back(readBufferChunkSize != 0 ? readBufferChunkSize
                                                              : QIODEVICE_BUFFERSIZE);
    } else {
        readBuffers.resize(count);
    }
    readChannelCount = count;
    setCurrentReadChannel(currentReadChannel);
}